

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Implicit_manifold_intersection_oracle.h
# Opt level: O1

VectorXd __thiscall
Gudhi::coxeter_triangulation::
Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
::
compute_lambda<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
          (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
           *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *simplex,
          Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          *triangulation)

{
  bool bVar1;
  DenseStorage<double,__1,__1,__1,_0> *pDVar2;
  undefined8 *puVar3;
  Vertex_handle *in_RCX;
  double *pdVar4;
  long lVar5;
  long lVar6;
  Index extraout_RDX;
  long lVar7;
  ActualDstType actualDst;
  VectorXd VVar8;
  VectorXd z;
  MatrixXd matrix;
  VectorXd *lambda;
  VectorXd v_coords;
  vector<int,_std::allocator<int>_> v;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_198;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  DenseStorage<double,__1,__1,__1,_0> *local_148;
  undefined1 local_140 [16];
  vector<int,_std::allocator<int>_> local_130;
  SrcXprType local_118;
  vector<int,_std::allocator<int>_> local_108;
  byte local_f0;
  void *local_e0;
  undefined1 local_d0 [48];
  const_iterator local_a0;
  const_iterator cStack_98;
  vector<int,_std::allocator<int>_> local_90;
  bool local_78;
  undefined7 uStack_77;
  double *local_68;
  
  local_168.m_data = (double *)0x0;
  local_168.m_rows = 0;
  local_168.m_cols = 0;
  local_148 = (DenseStorage<double,__1,__1,__1,_0> *)this;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_168,4,2,2);
  if (local_168.m_rows < 1) {
LAB_001223e4:
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                 );
  }
  lVar5 = 0;
  pdVar4 = local_168.m_data;
  do {
    if (local_168.m_cols <= lVar5) goto LAB_001223e4;
    *pdVar4 = 1.0;
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + local_168.m_rows;
  } while (lVar5 == 1);
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vertex_range((Vertex_range *)local_d0,
                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)triangulation);
  local_198.o_it_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._0_8_;
  local_198.o_end_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._8_8_;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_198.value_,(vector<int,_std::allocator<int>_> *)(local_d0 + 0x10));
  local_198.is_end_ = local_d0[0x28];
  local_118.m_dec =
       (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a0._M_current;
  local_118.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)cStack_98._M_current;
  std::vector<int,_std::allocator<int>_>::vector(&local_108,&local_90);
  local_f0 = local_78;
  if ((local_198.is_end_ & local_78) == 0) {
    lVar5 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_130,&local_198.value_);
      Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::cartesian_coordinates
                ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)&local_e0,in_RCX,1.0);
      Function_torus_in_R3::operator()((Function_torus_in_R3 *)local_140,(VectorXd *)simplex);
      free(local_e0);
      if ((long)local_140._8_8_ < 1) goto LAB_00122403;
      if ((local_168.m_rows < 2) || (local_168.m_cols <= lVar5)) goto LAB_001223e4;
      local_168.m_data[local_168.m_rows * lVar5 + 1] = *(double *)local_140._0_8_;
      free((void *)local_140._0_8_);
      if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_198.is_end_ == false) {
        Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::update_value(&local_198);
        local_198.o_it_._M_current = local_198.o_it_._M_current + 1;
        if (local_198.o_it_._M_current == local_198.o_end_._M_current) {
          local_198.is_end_ = true;
        }
      }
      lVar5 = lVar5 + 1;
    } while ((local_198.is_end_ != true) || ((local_f0 & 1) == 0));
  }
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_198.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((double *)local_d0._16_8_ != (double *)0x0) {
    operator_delete((void *)local_d0._16_8_,local_d0._32_8_ - local_d0._16_8_);
  }
  local_198.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_198.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  free((void *)0x0);
  pDVar2 = (DenseStorage<double,__1,__1,__1,_0> *)malloc(0x10);
  if (((ulong)pDVar2 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pDVar2 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = operator_delete;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_198.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2;
  pDVar2->m_data = (double *)0x3ff0000000000000;
  pDVar2->m_rows = 0;
  local_198.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)pDVar2;
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d0,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_168);
  Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
  _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)local_d0
             ,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_198);
  pDVar2 = local_148;
  local_148->m_data = (double *)0x0;
  local_148->m_rows = 0;
  local_118.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d0;
  if ((long)local_d0._16_8_ < 0) {
    local_118.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)&local_198;
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_118.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)&local_198;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)local_148,local_d0._16_8_,local_d0._16_8_,1);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,_1,_0,__1,_1> *)pDVar2,&local_118,(assign_op<double,_double> *)&local_130
       );
  free(local_68);
  free((void *)CONCAT71(uStack_77,local_78));
  free(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish);
  free(cStack_98._M_current);
  free((void *)CONCAT71(local_d0._41_7_,local_d0[0x28]));
  free((void *)local_d0._24_8_);
  free((void *)local_d0._0_8_);
  if (local_168.m_cols != pDVar2->m_rows) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_d0._8_8_ = pDVar2;
  local_118.m_dec =
       (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x3d719799812dea11;
  local_d0._0_8_ = &local_168;
  bVar1 = Eigen::internal::
          isApprox_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
          ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_198,
                (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                 *)local_d0,(RealScalar *)&local_118);
  if ((!bVar1) && (lVar5 = pDVar2->m_rows, lVar5 != 0)) {
    pdVar4 = pDVar2->m_data;
    lVar6 = 0;
    lVar7 = 0;
    if (0 < lVar5) {
      lVar7 = lVar5;
    }
    do {
      if (lVar7 == lVar6) {
LAB_00122403:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar4[lVar6] = NAN;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  free(local_198.o_it_._M_current);
  free(local_168.m_data);
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pDVar2;
  return (VectorXd)VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd compute_lambda(const Simplex_handle& simplex, const Triangulation& triangulation) const {
    std::size_t cod_d = this->cod_d();
    Eigen::MatrixXd matrix(cod_d + 1, cod_d + 1);
    for (std::size_t i = 0; i < cod_d + 1; ++i) matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : simplex.vertex_range()) {
      Eigen::VectorXd v_coords = fun_(triangulation.cartesian_coordinates(v));
      for (std::size_t i = 1; i < cod_d + 1; ++i) matrix(i, j) = v_coords(i - 1);
      j++;
    }
    Eigen::VectorXd z(cod_d + 1);
    z(0) = 1;
    for (std::size_t i = 1; i < cod_d + 1; ++i) z(i) = 0;
    Eigen::VectorXd lambda = matrix.colPivHouseholderQr().solve(z);
    if (!z.isApprox(matrix*lambda)) {
      // NaN non valid results
      for (std::size_t i = 0; i < (std::size_t)lambda.size(); ++i) lambda(i) =
        std::numeric_limits<double>::quiet_NaN();
    }
    return lambda;
  }